

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_chr
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  char local_9;
  
  local_9 = (char)this->abs_value;
  buffer<char>::push_back
            ((this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
             &local_9);
  return;
}

Assistant:

void on_chr() { *out++ = static_cast<Char>(abs_value); }